

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_db_readonly(sqlite3 *db,char *zDbName)

{
  Btree *p;
  undefined4 local_24;
  Btree *pBt;
  char *zDbName_local;
  sqlite3 *db_local;
  
  p = sqlite3DbNameToBtree(db,zDbName);
  if (p == (Btree *)0x0) {
    local_24 = -1;
  }
  else {
    local_24 = sqlite3BtreeIsReadonly(p);
  }
  return local_24;
}

Assistant:

SQLITE_API int sqlite3_db_readonly(sqlite3 *db, const char *zDbName){
  Btree *pBt;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return -1;
  }
#endif
  pBt = sqlite3DbNameToBtree(db, zDbName);
  return pBt ? sqlite3BtreeIsReadonly(pBt) : -1;
}